

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

int NFALUT::double_equal(double a,double b)

{
  double dVar1;
  double dVar2;
  
  if ((a == b) && (!NAN(a) && !NAN(b))) {
    return 1;
  }
  dVar1 = ABS(a);
  if (ABS(a) <= ABS(b)) {
    dVar1 = ABS(b);
  }
  dVar2 = 2.2250738585072014e-308;
  if (2.2250738585072014e-308 <= dVar1) {
    dVar2 = dVar1;
  }
  return (int)(ABS(a - b) / dVar2 <= 2.220446049250313e-14);
}

Assistant:

int NFALUT::double_equal(double a, double b)
{
	double abs_diff, aa, bb, abs_max;

	/* trivial case */
	if (a == b) return TRUE;

	abs_diff = fabs(a - b);
	aa = fabs(a);
	bb = fabs(b);
	abs_max = aa > bb ? aa : bb;

	/* DBL_MIN is the smallest normalized number, thus, the smallest
	number whose relative error is bounded by DBL_EPSILON. For
	smaller numbers, the same quantization steps as for DBL_MIN
	are used. Then, for smaller numbers, a meaningful "relative"
	error should be computed by dividing the difference by DBL_MIN. */
	if (abs_max < DBL_MIN) abs_max = DBL_MIN;

	/* equal if relative error <= factor x eps */
	return (abs_diff / abs_max) <= (RELATIVE_ERROR_FACTOR * DBL_EPSILON);
}